

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void pop_heap_suite::pop_increasing_predicate(void)

{
  array<int,_4UL> expect;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38 [2];
  
  local_48 = 0xb;
  iStack_44 = 0x16;
  uStack_40 = 0x21;
  uStack_3c = 0x2c;
  vista::pop_heap<false,int*,std::greater<int>>(&local_48,local_38);
  uStack_3c = 0;
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x228,"void pop_heap_suite::pop_increasing_predicate()",&local_48,local_38,
             expect._M_elems,&local_48);
  vista::pop_heap<false,int*,std::greater<int>>(&local_48,&uStack_3c);
  uStack_40 = 0;
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x22f,"void pop_heap_suite::pop_increasing_predicate()",&local_48,local_38,
             expect._M_elems,&local_48);
  local_48 = iStack_44;
  iStack_44 = 0;
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x236,"void pop_heap_suite::pop_increasing_predicate()",&local_48,local_38,
             expect._M_elems,&local_48);
  local_48 = 0;
  expect._M_elems[0] = 0;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x23d,"void pop_heap_suite::pop_increasing_predicate()",&local_48,local_38,
             expect._M_elems,&local_48);
  return;
}

Assistant:

void pop_increasing_predicate()
{
    std::array<int, 4> heap = { 11, 22, 33, 44 }; // Result of push_suite::push_increasing_predicate
    auto last = heap.end();
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 22, 44, 33, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 33, 44, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 44, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}